

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Policy.h
# Opt level: O2

void __thiscall Policy::Print(Policy *this)

{
  string asStack_28 [32];
  
  (*this->_vptr_Policy[4])(asStack_28,this);
  std::operator<<((ostream *)&std::cout,asStack_28);
  std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

virtual void Print() const
        { std::cout << SoftPrint();}